

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

void __thiscall QLineEdit::setClearButtonEnabled(QLineEdit *this,bool enable)

{
  QLineEditPrivate *this_00;
  bool bVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_01;
  QWidget *pQVar2;
  ulong uVar3;
  QAction *action;
  long in_FS_OFFSET;
  QAnyStringView aName;
  QAnyStringView QVar4;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  bVar1 = isClearButtonEnabled(this);
  if (bVar1 != enable) {
    if (enable) {
      this_01.m_data = operator_new(0x10);
      QLineEditPrivate::clearButtonIcon((QLineEditPrivate *)&stack0xffffffffffffffc0);
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      local_58.size = 0;
      QAction::QAction((QAction *)this_01.m_data_utf8,(QIcon *)&stack0xffffffffffffffc0,
                       (QString *)&local_58,(QObject *)this);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QIcon::~QIcon((QIcon *)&stack0xffffffffffffffc0);
      QAction::setEnabled(this_01._0_1_);
      QtPrivate::lengthHelperPointer<char>("_q_qlineeditclearaction");
      QVar4.m_size = (size_t)"_q_qlineeditclearaction";
      QVar4.field_0.m_data = this_01.m_data;
      QObject::setObjectName(QVar4);
      pQVar2 = QLineEditPrivate::addAction
                         (this_00,(QAction *)this_01.m_data_utf8,(QAction *)0x0,TrailingPosition,5);
      text((QString *)&local_58,this);
      (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,local_58.size != 0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    else {
      uVar3 = QtPrivate::lengthHelperPointer<char>("_q_qlineeditclearaction");
      aName.m_size = uVar3 | 0x4000000000000000;
      aName.field_0.m_data_utf8 = "_q_qlineeditclearaction";
      action = QObject::findChild<QAction*>((QObject *)this,aName,(FindChildOptions)0x1);
      QLineEditPrivate::removeAction(this_00,action);
      if (action != (QAction *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (**(code **)(*(long *)action + 0x20))(action);
          return;
        }
        goto LAB_003eb6bc;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003eb6bc:
  __stack_chk_fail();
}

Assistant:

void QLineEdit::setClearButtonEnabled(bool enable)
{
#if QT_CONFIG(action)
    Q_D(QLineEdit);
    if (enable == isClearButtonEnabled())
        return;
    if (enable) {
        QAction *clearAction = new QAction(d->clearButtonIcon(), QString(), this);
        clearAction->setEnabled(!isReadOnly());
        clearAction->setObjectName(QLatin1StringView(clearButtonActionNameC));

        int flags = QLineEditPrivate::SideWidgetClearButton | QLineEditPrivate::SideWidgetFadeInWithText;
        auto widgetAction = d->addAction(clearAction, nullptr, QLineEdit::TrailingPosition, flags);
        widgetAction->setVisible(!text().isEmpty());
    } else {
        QAction *clearAction = findChild<QAction *>(QLatin1StringView(clearButtonActionNameC));
        Q_ASSERT(clearAction);
        d->removeAction(clearAction);
        delete clearAction;
    }
#else
    Q_UNUSED(enable);
#endif // QT_CONFIG(action)
}